

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

bool __thiscall QMetaProperty::isFlagType(QMetaProperty *this)

{
  QMetaObject *pQVar1;
  
  if ((((this->mobj != (QMetaObject *)0x0) && (((this->data).d[2] & 8) != 0)) &&
      (pQVar1 = (this->menum).mobj, pQVar1 != (QMetaObject *)0x0)) &&
     ((pQVar1->d).stringdata != (uint *)0x0)) {
    return (bool)((byte)(this->menum).data.d[2] & 1);
  }
  return false;
}

Assistant:

bool QMetaProperty::isEnumType() const
{
    if (!mobj)
        return false;
    return (data.flags() & EnumOrFlag) && menum.name();
}